

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

QModelIndex * __thiscall
QtMWidgets::PickerPrivate::indexForPos
          (QModelIndex *__return_storage_ptr__,PickerPrivate *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  QPersistentModelIndex index;
  QRect r;
  QPersistentModelIndex local_50 [8];
  QPoint local_48;
  int local_40;
  int local_3c;
  QPersistentModelIndex *local_38;
  
  if (-1 < this->itemsCount) {
    iVar5 = this->drawItemOffset;
    local_38 = &this->topItemIndex;
    iVar4 = 0;
    do {
      lVar1 = *(long *)&this->q->field_0x20;
      local_40 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
      local_48.xp = this->itemSideMargin;
      local_3c = iVar5 + -1 + this->stringHeight;
      local_48.yp = iVar5;
      cVar3 = QRect::contains(&local_48,SUB81(pos,0));
      if (cVar3 != '\0') {
        QPersistentModelIndex::QPersistentModelIndex(local_50,local_38);
        if (iVar4 != 0) {
          do {
            makeNextIndex(this,local_50);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,local_50);
        QPersistentModelIndex::~QPersistentModelIndex(local_50);
        return __return_storage_ptr__;
      }
      iVar5 = iVar5 + this->stringHeight + this->itemTopMargin;
      bVar2 = iVar4 < this->itemsCount;
      iVar4 = iVar4 + 1;
    } while (bVar2);
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex
PickerPrivate::indexForPos( const QPoint & pos )
{
	int offset = drawItemOffset;

	for( int i = 0; i < itemsCount + 1; ++i )
	{
		const QRect r( q->rect().x() + itemSideMargin, offset,
			q->rect().width() - itemSideMargin, stringHeight );

		if( r.contains( pos ) )
		{
			QPersistentModelIndex index = topItemIndex;

			for( int j = 0; j < i; ++j )
				makeNextIndex( index );

			return index;
		}

		offset += stringHeight + itemTopMargin;
	}

	return QModelIndex();
}